

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O0

int addbyter(uchar outc,void *f)

{
  uchar *puVar1;
  bool bVar2;
  nsprintf *infop;
  void *f_local;
  uchar outc_local;
  
  bVar2 = *(ulong *)((long)f + 0x10) <= *(ulong *)((long)f + 8);
  if (!bVar2) {
    puVar1 = *f;
    *(uchar **)f = puVar1 + 1;
    *puVar1 = outc;
    *(long *)((long)f + 8) = *(long *)((long)f + 8) + 1;
  }
  f_local._4_4_ = (uint)bVar2;
  return f_local._4_4_;
}

Assistant:

static int addbyter(unsigned char outc, void *f)
{
  struct nsprintf *infop = f;
  if(infop->length < infop->max) {
    /* only do this if we haven't reached max length yet */
    *infop->buffer++ = outc; /* store */
    infop->length++; /* we are now one byte larger */
    return 0;     /* fputc() returns like this on success */
  }
  return 1;
}